

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsSparseMatrix * __thiscall HEkk::getScaledAMatrixPointer(HEkk *this)

{
  HighsSparseMatrix *pHVar1;
  HighsSparseMatrix *this_00;
  
  pHVar1 = &(this->lp_).a_matrix_;
  this_00 = pHVar1;
  if (((this->lp_).scale_.has_scaling == true) && ((this->lp_).is_scaled_ == false)) {
    this_00 = &this->scaled_a_matrix_;
    HighsSparseMatrix::operator=(this_00,pHVar1);
    HighsSparseMatrix::applyScale(this_00,&(this->lp_).scale_);
  }
  return this_00;
}

Assistant:

HighsSparseMatrix* HEkk::getScaledAMatrixPointer() {
  // Return a pointer to either the constraint matrix or a scaled copy
  // (that is a member of the HEkk class), with the latter returned if
  // the LP has scaling factors but is unscaled.
  HighsSparseMatrix* local_scaled_a_matrix = &(this->lp_.a_matrix_);
  if (this->lp_.scale_.has_scaling && !this->lp_.is_scaled_) {
    scaled_a_matrix_ = this->lp_.a_matrix_;
    scaled_a_matrix_.applyScale(this->lp_.scale_);
    local_scaled_a_matrix = &scaled_a_matrix_;
  }
  return local_scaled_a_matrix;
}